

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O1

bool __thiscall crnlib::buffer_stream::seek(buffer_stream *this,int64 ofs,bool relative)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  
  bVar1 = (this->super_data_stream).field_0x1a;
  if (((bVar1 & 1) != 0) && (((this->super_data_stream).m_attribs & 4) != 0)) {
    uVar3 = (ulong)this->m_ofs;
    if (!relative) {
      uVar3 = 0;
    }
    lVar2 = uVar3 + ofs;
    if ((-1 < lVar2) && (lVar2 <= (long)(ulong)this->m_size)) {
      this->m_ofs = (uint)lVar2;
      (this->super_data_stream).field_0x1a = bVar1 & 0xfb;
      return true;
    }
  }
  return false;
}

Assistant:

virtual bool seek(int64 ofs, bool relative) {
    if ((!m_opened) || (!is_seekable()))
      return false;

    int64 new_ofs = relative ? (m_ofs + ofs) : ofs;

    if (new_ofs < 0)
      return false;
    else if (new_ofs > m_size)
      return false;

    m_ofs = static_cast<uint>(new_ofs);

    post_seek();

    return true;
  }